

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O2

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::ComputeShape
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,TPZVec<double> *qsi,
          TPZMaterialData *data)

{
  TPZFNMatrix<20,_double> *phi;
  double dVar1;
  uint uVar2;
  TPZCompMesh *pTVar3;
  TPZGeoEl *pTVar4;
  double *pdVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  long col;
  int d;
  long col_00;
  TPZFMatrix<double> gradx;
  TPZFNMatrix<9,_double> gradxlocal;
  TPZFNMatrix<9,_double> axeslocal;
  
  pTVar3 = TPZCompEl::Mesh((TPZCompEl *)this);
  TPZChunkVector<TPZConnect,_10>::operator[]
            (&(pTVar3->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,this->fbottom_c_index);
  pTVar3 = TPZCompEl::Mesh((TPZCompEl *)this);
  TPZChunkVector<TPZConnect,_10>::operator[]
            (&(pTVar3->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,this->ftop_c_index);
  uVar2 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                 super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))(this);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&axeslocal,3,3);
  ExpandAxes(&(data->axes).super_TPZFMatrix<double>,(TPZMatrix<double> *)&axeslocal);
  gradxlocal.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix(&gradx,3,2,(double *)&gradxlocal);
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar4 + 0x230))(pTVar4,qsi,&gradx);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradxlocal,3,3);
  for (col = 0; col != 3; col = col + 1) {
    for (col_00 = 0; col_00 != 2; col_00 = col_00 + 1) {
      pdVar5 = TPZFMatrix<double>::operator()(&gradx,col,col_00);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(&gradxlocal.super_TPZFMatrix<double>,col,col_00);
      *pdVar5 = dVar1;
    }
    pdVar5 = TPZFMatrix<double>::operator()(&axeslocal.super_TPZFMatrix<double>,2,col);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&gradxlocal.super_TPZFMatrix<double>,col,2);
    *pdVar5 = dVar1;
  }
  phi = &data->phi;
  TPZShapeHDivCollapsed<pzshape::TPZShapeTriang>::Shape
            (qsi,&data->super_TPZShapeData,&phi->super_TPZFMatrix<double>,
             &(data->divphi).super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator*=(&(data->divphi).super_TPZFMatrix<double>,1.0 / data->detjac);
  TPZMatrix<double>::Multiply
            ((TPZMatrix<double> *)&gradxlocal,&phi->super_TPZFMatrix<double>,
             &(data->fDeformedDirections).super_TPZFMatrix<double>,0);
  TPZFMatrix<double>::operator*=
            (&(data->fDeformedDirections).super_TPZFMatrix<double>,1.0 / data->detjac);
  TPZManVector<std::pair<int,_long>,_20>::Resize(&data->fVecShapeIndex,(long)(int)uVar2);
  TPZFMatrix<double>::Resize(&phi->super_TPZFMatrix<double>,(long)(int)uVar2,1);
  pdVar5 = (data->phi).super_TPZFMatrix<double>.fElem;
  uVar7 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar7;
  }
  plVar6 = &((data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore)->second;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    ((pair<int,_long> *)(plVar6 + -1))->first = (int)uVar7;
    *plVar6 = uVar7;
    pdVar5[uVar7] = 1.0;
    plVar6 = plVar6 + 2;
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradxlocal);
  TPZFMatrix<double>::~TPZFMatrix(&gradx);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&axeslocal);
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data) {


    // Some variable definitions
    TPZConnect& connbot = this->Mesh()->ConnectVec()[fbottom_c_index];
    TPZConnect& conntop = this->Mesh()->ConnectVec()[ftop_c_index];
    const int toporder = conntop.Order();
    const int bottomorder = connbot.Order();
    const int64_t nvec_top = conntop.NShape();
    const int64_t nvec_bottom = connbot.NShape();
    const int64_t nvecshapecollpased = this->NShapeF();
    const int64_t numvec = nvecshapecollpased - nvec_top - nvec_bottom;
    const int dim = TSHAPE::Dimension+1;
    
    // Expanding element axes
    TPZFNMatrix<9,REAL> axeslocal(TSHAPE::Dimension+1,3);
    ExpandAxes(data.axes, axeslocal);
    
    // adding a column do gradx pointing to the normal direction (direction that communicates with the 3d neighbor element)
    TPZFMatrix<REAL> gradx(3,TSHAPE::Dimension,0.);
    this->Reference()->GradX(qsi, gradx);
    TPZFNMatrix<9> gradxlocal(3,dim);
    for (int i=0; i<3; i++) {
        for (int d=0; d<dim-1; d++) {
            gradxlocal(i,d) = gradx(i,d);
        }
        gradxlocal(i,dim-1) = axeslocal(dim-1,i);
    }
    
    // Computing shape functions using TPZShapeHDivCollapsed structure
    TPZShapeData& shapedata = data;
    TPZShapeHDivCollapsed<TSHAPE>::Shape(qsi,shapedata,data.phi,data.divphi);
    data.divphi *= 1./data.detjac;
    gradxlocal.Multiply(data.phi,data.fDeformedDirections);
    data.fDeformedDirections *= 1./data.detjac;
    
    // Filling phi with 1 and fVecShapeIndex with 1,1 to make actual materials work
    data.fVecShapeIndex.Resize(nvecshapecollpased);
    data.phi.Resize(nvecshapecollpased,1);
    for(int i=0; i<nvecshapecollpased; i++)
    {
        data.fVecShapeIndex[i] = std::pair<int,int64_t>(i,i);
        data.phi(i) = 1.;
    }
}